

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O0

int mbedtls_ccm_self_test(int verbose)

{
  int iVar1;
  ulong uStack_a0;
  int ret;
  size_t i;
  uchar out [32];
  undefined1 local_70 [8];
  mbedtls_ccm_context ctx;
  int verbose_local;
  
  ctx.cipher_ctx.cipher_ctx._0_4_ = verbose;
  mbedtls_ccm_init((mbedtls_ccm_context *)local_70);
  iVar1 = mbedtls_ccm_setkey((mbedtls_ccm_context *)local_70,MBEDTLS_CIPHER_ID_AES,
                             "@ABCDEFGHIJKLMNO",0x80);
  if (iVar1 == 0) {
    for (uStack_a0 = 0; uStack_a0 < 3; uStack_a0 = uStack_a0 + 1) {
      if ((int)ctx.cipher_ctx.cipher_ctx != 0) {
        printf("  CCM-AES #%u: ",(ulong)((int)uStack_a0 + 1));
      }
      iVar1 = mbedtls_ccm_encrypt_and_tag
                        ((mbedtls_ccm_context *)local_70,msg_len[uStack_a0],
                         "\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b",iv_len[uStack_a0],"",
                         add_len[uStack_a0]," !\"#$%&\'()*+,-./01234567",(uchar *)&i,
                         out + (msg_len[uStack_a0] - 8),tag_len[uStack_a0]);
      if ((iVar1 != 0) ||
         (iVar1 = memcmp(&i,res + uStack_a0,msg_len[uStack_a0] + tag_len[uStack_a0]), iVar1 != 0)) {
        if ((int)ctx.cipher_ctx.cipher_ctx != 0) {
          printf("failed\n");
        }
        return 1;
      }
      iVar1 = mbedtls_ccm_auth_decrypt
                        ((mbedtls_ccm_context *)local_70,msg_len[uStack_a0],
                         "\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b",iv_len[uStack_a0],"",
                         add_len[uStack_a0],res[uStack_a0],(uchar *)&i,
                         res[uStack_a0] + msg_len[uStack_a0],tag_len[uStack_a0]);
      if ((iVar1 != 0) ||
         (iVar1 = memcmp(&i," !\"#$%&\'()*+,-./01234567",msg_len[uStack_a0]), iVar1 != 0)) {
        if ((int)ctx.cipher_ctx.cipher_ctx != 0) {
          printf("failed\n");
        }
        return 1;
      }
      if ((int)ctx.cipher_ctx.cipher_ctx != 0) {
        printf("passed\n");
      }
    }
    mbedtls_ccm_free((mbedtls_ccm_context *)local_70);
    if ((int)ctx.cipher_ctx.cipher_ctx != 0) {
      printf(anon_var_dwarf_60bc4 + 8);
    }
    ctx.cipher_ctx.cipher_ctx._4_4_ = 0;
  }
  else {
    if ((int)ctx.cipher_ctx.cipher_ctx != 0) {
      printf("  CCM: setup failed");
    }
    ctx.cipher_ctx.cipher_ctx._4_4_ = 1;
  }
  return ctx.cipher_ctx.cipher_ctx._4_4_;
}

Assistant:

int mbedtls_ccm_self_test( int verbose )
{
    mbedtls_ccm_context ctx;
    unsigned char out[32];
    size_t i;
    int ret;

    mbedtls_ccm_init( &ctx );

    if( mbedtls_ccm_setkey( &ctx, MBEDTLS_CIPHER_ID_AES, key, 8 * sizeof key ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "  CCM: setup failed" );

        return( 1 );
    }

    for( i = 0; i < NB_TESTS; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  CCM-AES #%u: ", (unsigned int) i + 1 );

        ret = mbedtls_ccm_encrypt_and_tag( &ctx, msg_len[i],
                                   iv, iv_len[i], ad, add_len[i],
                                   msg, out,
                                   out + msg_len[i], tag_len[i] );

        if( ret != 0 ||
            memcmp( out, res[i], msg_len[i] + tag_len[i] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }

        ret = mbedtls_ccm_auth_decrypt( &ctx, msg_len[i],
                                iv, iv_len[i], ad, add_len[i],
                                res[i], out,
                                res[i] + msg_len[i], tag_len[i] );

        if( ret != 0 ||
            memcmp( out, msg, msg_len[i] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    mbedtls_ccm_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}